

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

logical pnga_set_update4_info(Integer g_a)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  C_Integer *pCVar7;
  global_array_t *pgVar8;
  ushort uVar9;
  int _d;
  int iVar10;
  Integer proc;
  logical lVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  Integer *map;
  long lVar15;
  long lVar16;
  size_t sVar17;
  Integer IVar18;
  long *plVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  C_Integer CVar24;
  int *piVar25;
  undefined8 *puVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  char *pcVar30;
  long *plVar31;
  long ndim;
  long lVar32;
  int _index [7];
  double *local_570;
  Integer _hi [7];
  Integer np;
  long local_4f8;
  long local_4f0;
  Integer slo_rcv [7];
  Integer shi_rcv [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer width [7];
  char err_string [256];
  Integer plo_rcv [7];
  Integer plo_snd [7];
  Integer ld_loc [7];
  Integer phi_rcv [7];
  Integer phi_snd [7];
  Integer hi_rcv [7];
  Integer lo_rcv [7];
  Integer dims [7];
  Integer increment [7];
  Integer index [7];
  
  proc = pnga_nodeid();
  lVar11 = pnga_has_ghosts(g_a);
  if (lVar11 != 0) {
    lVar11 = gai_check_ghost_distr(g_a);
    pgVar8 = GA;
    if (lVar11 == 0) {
      return 0;
    }
    lVar1 = g_a + 1000;
    iVar3 = GA[lVar1].elemsize;
    lVar12 = (long)iVar3;
    iVar10 = (int)GA[lVar1].ndim;
    ndim = (long)iVar10;
    iVar4 = GA[lVar1].p_handle;
    pdVar13 = (double *)malloc((long)(((iVar10 * 0xc + 0x28) / 8 + 1) * iVar10 * 2 + 1) << 3);
    pgVar8[lVar1].cache = pdVar13;
    local_570 = GA[lVar1].cache;
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    IVar18 = GAnproc;
    lVar14 = 0;
    lVar32 = 0;
    if (0 < ndim) {
      lVar32 = ndim;
    }
    local_4f0 = lVar32 * 8;
    for (; local_4f0 - lVar14 != 0; lVar14 = lVar14 + 8) {
      *(undefined8 *)((long)increment + lVar14) = 0;
      *(undefined8 *)((long)width + lVar14) = *(undefined8 *)((long)GA[g_a + 1000].width + lVar14);
      *(undefined8 *)((long)dims + lVar14) = *(undefined8 *)((long)GA[g_a + 1000].dims + lVar14);
      if ((*(long *)((long)lo_loc + lVar14) == 0) && (*(long *)((long)hi_loc + lVar14) == -1)) {
        *local_570 = 0.0;
        return 0;
      }
    }
    map = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (map == (Integer *)0x0) {
      pnga_error("pnga_set_update4_info:malloc failed (_ga_map)",0);
      IVar18 = GAnproc;
    }
    pdVar13 = (double *)malloc(IVar18 << 3);
    if (pdVar13 == (double *)0x0) {
      pnga_error("pnga_set_update4_info:malloc failed (_ga_proclist)",0);
    }
    pnga_proc_topology(g_a,proc,index);
    lVar14 = 1;
    for (lVar15 = 0; lVar32 != lVar15; lVar15 = lVar15 + 1) {
      lVar14 = lVar14 * ((hi_loc[lVar15] - lo_loc[lVar15]) + width[lVar15] * 2 + 1);
    }
    lVar15 = 1;
    for (lVar29 = 0; lVar32 != lVar29; lVar29 = lVar29 + 1) {
      lVar16 = (lVar14 / ((hi_loc[lVar29] - lo_loc[lVar29]) + width[lVar29] * 2 + 1)) *
               width[lVar29];
      if (lVar15 <= lVar16) {
        lVar15 = lVar16;
      }
    }
    *local_570 = (double)(lVar15 * lVar12);
    local_570 = local_570 + 1;
    lVar15 = (long)(int)proc;
    lVar14 = 1;
    if (1 < ndim) {
      lVar14 = ndim;
    }
    lVar29 = 0;
    local_4f8 = lVar14 + -1;
    for (lVar14 = 0; lVar14 != lVar32; lVar14 = lVar14 + 1) {
      if (width[lVar14] != 0) {
        get_remote_block_neg(lVar14,ndim,lo_loc,hi_loc,slo_rcv,shi_rcv,dims,width);
        lVar11 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)pdVar13,&np);
        if (lVar11 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA[lVar1].name);
          sVar17 = strlen(err_string);
          sprintf(err_string + (int)sVar17," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
          sVar17 = strlen(err_string);
          lVar16 = 1;
          while( true ) {
            IVar18 = pnga_ndim(g_a);
            pcVar30 = err_string + (int)sVar17;
            if (IVar18 <= lVar16) break;
            sprintf(pcVar30,",%ld:%ld ",slo_rcv[lVar16],shi_rcv[lVar16]);
            sVar17 = strlen(err_string);
            lVar16 = lVar16 + 1;
          }
          pcVar30[0] = ']';
          pcVar30[1] = '\0';
          pnga_error(err_string,g_a);
        }
        dVar6 = *pdVar13;
        local_570[2] = dVar6;
        if (-1 < iVar4) {
          local_570[2] = (double)(long)PGRP_LIST[iVar4].inv_map_proc_list[(long)dVar6];
        }
        piVar25 = (int *)((long)local_570 + ndim * 4 + 0x20);
        plVar19 = (long *)(piVar25 + ndim);
        puVar26 = (undefined8 *)((long)plVar19 + ndim * 4 + 8);
        for (lVar16 = 0; lVar32 != lVar16; lVar16 = lVar16 + 1) {
          if (lVar14 == lVar16) {
            lVar22 = hi_loc[lVar14] + 1;
            lVar20 = hi_loc[lVar14] + width[lVar14];
          }
          else {
            lVar22 = lo_loc[lVar16];
            lVar20 = hi_loc[lVar16];
          }
          lo_rcv[lVar16] = lVar22;
          hi_rcv[lVar16] = lVar20;
        }
        for (lVar16 = 0; lVar32 != lVar16; lVar16 = lVar16 + 1) {
          if (lVar14 == lVar16) {
            lVar22 = hi_rcv[lVar14];
            if (dims[lVar14] < lVar22) {
              slo_rcv[lVar14] = 1;
              lVar22 = width[lVar14];
            }
            else {
              slo_rcv[lVar14] = lo_rcv[lVar14];
            }
            shi_rcv[lVar14] = lVar22;
          }
          else {
            slo_rcv[lVar16] = lo_rcv[lVar16];
            shi_rcv[lVar16] = hi_rcv[lVar16];
          }
        }
        lVar11 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)pdVar13,&np);
        if (lVar11 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA[lVar1].name);
          sVar17 = strlen(err_string);
          sprintf(err_string + (int)sVar17," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
          sVar17 = strlen(err_string);
          lVar16 = 1;
          while( true ) {
            IVar18 = pnga_ndim(g_a);
            pcVar30 = err_string + (int)sVar17;
            if (IVar18 <= lVar16) break;
            sprintf(pcVar30,",%ld:%ld ",slo_rcv[lVar16],shi_rcv[lVar16]);
            sVar17 = strlen(err_string);
            lVar16 = lVar16 + 1;
          }
          pcVar30[0] = ']';
          pcVar30[1] = '\0';
          pnga_error(err_string,g_a);
        }
        dVar6 = *pdVar13;
        local_570[3] = dVar6;
        if (-1 < iVar4) {
          local_570[3] = (double)(long)PGRP_LIST[iVar4].inv_map_proc_list[(long)dVar6];
        }
        for (lVar16 = 0; local_4f0 != lVar16; lVar16 = lVar16 + 8) {
          if (*(long *)((long)increment + lVar16) == 0) {
            if (lVar29 == lVar16) {
              lVar22 = width[lVar14];
              plo_snd[lVar14] = lVar22;
              phi_snd[lVar14] = lVar22 * 2 + -1;
              plo_rcv[lVar14] = lVar22 + (hi_loc[lVar14] - lo_loc[lVar14]) + 1;
              phi_rcv[lVar14] = (hi_loc[lVar14] - lo_loc[lVar14]) + lVar22 * 2;
            }
            else {
              lVar22 = *(long *)((long)width + lVar16);
              *(long *)((long)plo_snd + lVar16) = lVar22;
              lVar20 = (*(long *)((long)hi_loc + lVar16) - *(long *)((long)lo_loc + lVar16)) +
                       lVar22;
              *(long *)((long)phi_snd + lVar16) = lVar20;
              *(long *)((long)plo_rcv + lVar16) = lVar22;
              *(long *)((long)phi_rcv + lVar16) = lVar20;
            }
          }
          else {
            *(undefined8 *)((long)plo_rcv + lVar16) = 0;
            lVar22 = (*(long *)((long)hi_loc + lVar16) - *(long *)((long)lo_loc + lVar16)) +
                     *(long *)((long)increment + lVar16);
            *(long *)((long)phi_rcv + lVar16) = lVar22;
            *(undefined8 *)((long)plo_snd + lVar16) = 0;
            *(long *)((long)phi_snd + lVar16) = lVar22;
          }
        }
        uVar2 = GA[lVar1].ndim;
        lVar16 = (long)(short)uVar2;
        iVar10 = GA[lVar1].distr_type;
        if (iVar10 - 1U < 3) {
          lVar20 = lVar15 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar20;
          IVar18 = proc;
          lVar22 = 0;
          while (lVar22 + 1 < lVar16) {
            IVar18 = (long)((int)IVar18 - (int)lVar20) / GA[g_a + 1000].num_blocks[lVar22];
            lVar20 = (long)(int)IVar18 % GA[g_a + 1000].num_blocks[lVar22 + 1];
            _index[lVar22 + 1] = (int)lVar20;
            lVar22 = lVar22 + 1;
          }
          uVar9 = 0;
          if (0 < (short)uVar2) {
            uVar9 = uVar2;
          }
          for (lVar22 = 0; (ulong)uVar9 * 4 != lVar22; lVar22 = lVar22 + 4) {
            iVar10 = *(int *)((long)_index + lVar22);
            lVar20 = *(long *)((long)GA[g_a + 1000].block_dims + lVar22 * 2);
            *(long *)(err_string + lVar22 * 2) = lVar20 * iVar10 + 1;
            lVar20 = ((long)iVar10 + 1) * lVar20;
            lVar21 = *(long *)((long)GA[g_a + 1000].dims + lVar22 * 2);
            if (lVar21 <= lVar20) {
              lVar20 = lVar21;
            }
            *(long *)((long)_hi + lVar22 * 2) = lVar20;
          }
        }
        else if (iVar10 == 4) {
          lVar20 = lVar15 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar20;
          IVar18 = proc;
          lVar22 = 0;
          while (lVar22 + 1 < lVar16) {
            IVar18 = (long)((int)IVar18 - (int)lVar20) / GA[g_a + 1000].num_blocks[lVar22];
            lVar20 = (long)(int)IVar18 % GA[g_a + 1000].num_blocks[lVar22 + 1];
            _index[lVar22 + 1] = (int)lVar20;
            lVar22 = lVar22 + 1;
          }
          lVar22 = 0;
          uVar9 = 0;
          if (0 < (short)uVar2) {
            uVar9 = uVar2;
          }
          iVar10 = 0;
          for (; (ulong)uVar9 * 4 != lVar22; lVar22 = lVar22 + 4) {
            pCVar7 = GA[lVar1].mapc;
            iVar5 = *(int *)((long)_index + lVar22);
            lVar21 = (long)iVar10 + (long)iVar5;
            *(C_Integer *)(err_string + lVar22 * 2) = pCVar7[lVar21];
            lVar20 = *(long *)((long)GA[lVar1].num_blocks + lVar22 * 2);
            if ((long)iVar5 < lVar20 + -1) {
              lVar21 = pCVar7[lVar21 + 1] + -1;
            }
            else {
              lVar21 = *(long *)((long)GA[lVar1].dims + lVar22 * 2);
            }
            *(long *)((long)_hi + lVar22 * 2) = lVar21;
            iVar10 = iVar10 + (int)lVar20;
          }
        }
        else if (iVar10 == 0) {
          if (GA[lVar1].num_rstrctd == 0) {
            lVar22 = 0;
            if (0 < lVar16) {
              lVar22 = lVar16;
            }
            lVar20 = 1;
            for (lVar21 = 0; lVar22 != lVar21; lVar21 = lVar21 + 1) {
              lVar20 = lVar20 * GA[g_a + 1000].nblock[lVar21];
            }
            if ((proc < 0) || (lVar20 <= proc)) {
              for (lVar20 = 0; lVar22 != lVar20; lVar20 = lVar20 + 1) {
                plo_rcv[lVar20 + -0x20] = 0;
                _hi[lVar20] = -1;
              }
            }
            else {
              lVar20 = 0;
              IVar18 = proc;
              for (lVar21 = 0; lVar22 != lVar21; lVar21 = lVar21 + 1) {
                lVar27 = (long)GA[g_a + 1000].nblock[lVar21];
                lVar23 = IVar18 % lVar27;
                pCVar7 = GA[lVar1].mapc;
                plo_rcv[lVar21 + -0x20] = pCVar7[lVar23 + lVar20];
                if (lVar23 == lVar27 + -1) {
                  CVar24 = GA[g_a + 1000].dims[lVar21];
                }
                else {
                  CVar24 = pCVar7[lVar23 + lVar20 + 1] + -1;
                }
                lVar20 = lVar20 + lVar27;
                _hi[lVar21] = CVar24;
                IVar18 = IVar18 / lVar27;
              }
            }
          }
          else if (proc < GA[lVar1].num_rstrctd) {
            lVar22 = 0;
            if (0 < lVar16) {
              lVar22 = lVar16;
            }
            lVar20 = 1;
            for (lVar21 = 0; lVar22 != lVar21; lVar21 = lVar21 + 1) {
              lVar20 = lVar20 * GA[g_a + 1000].nblock[lVar21];
            }
            if ((proc < 0) || (lVar20 <= proc)) {
              for (lVar20 = 0; lVar22 != lVar20; lVar20 = lVar20 + 1) {
                plo_rcv[lVar20 + -0x20] = 0;
                _hi[lVar20] = -1;
              }
            }
            else {
              lVar20 = 0;
              IVar18 = proc;
              for (lVar21 = 0; lVar22 != lVar21; lVar21 = lVar21 + 1) {
                lVar27 = (long)GA[g_a + 1000].nblock[lVar21];
                lVar23 = IVar18 % lVar27;
                pCVar7 = GA[lVar1].mapc;
                plo_rcv[lVar21 + -0x20] = pCVar7[lVar23 + lVar20];
                if (lVar23 == lVar27 + -1) {
                  CVar24 = GA[g_a + 1000].dims[lVar21];
                }
                else {
                  CVar24 = pCVar7[lVar23 + lVar20 + 1] + -1;
                }
                lVar20 = lVar20 + lVar27;
                _hi[lVar21] = CVar24;
                IVar18 = IVar18 / lVar27;
              }
            }
          }
          else {
            iVar10 = 0;
            if (0 < (short)uVar2) {
              iVar10 = (int)(short)uVar2;
            }
            for (lVar22 = 0; iVar10 != lVar22; lVar22 = lVar22 + 1) {
              plo_rcv[lVar22 + -0x20] = 0;
              _hi[lVar22] = -1;
            }
          }
        }
        lVar22 = lVar16 + -1;
        if (lVar22 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
        }
        if (lVar22 < 1) {
          lVar22 = 0;
        }
        lVar21 = 0;
        lVar20 = 1;
        for (lVar23 = 0; lVar22 != lVar23; lVar23 = lVar23 + 1) {
          lVar21 = lVar21 + plo_snd[lVar23] * lVar20;
          lVar27 = (_hi[lVar23] - plo_rcv[lVar23 + -0x20]) + GA[g_a + 1000].width[lVar23] * 2 + 1;
          ld_loc[lVar23] = lVar27;
          lVar20 = lVar20 * lVar27;
        }
        *local_570 = (double)(GA[lVar1].ptr[proc] +
                             (long)GA[lVar1].elemsize * (lVar20 * plo_snd[lVar16 + -1] + lVar21));
        uVar2 = GA[lVar1].ndim;
        lVar16 = (long)(short)uVar2;
        iVar10 = GA[lVar1].distr_type;
        if (iVar10 - 1U < 3) {
          lVar20 = lVar15 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar20;
          IVar18 = proc;
          lVar22 = 0;
          while (lVar22 + 1 < lVar16) {
            IVar18 = (long)((int)IVar18 - (int)lVar20) / GA[g_a + 1000].num_blocks[lVar22];
            lVar20 = (long)(int)IVar18 % GA[g_a + 1000].num_blocks[lVar22 + 1];
            _index[lVar22 + 1] = (int)lVar20;
            lVar22 = lVar22 + 1;
          }
          uVar9 = 0;
          if (0 < (short)uVar2) {
            uVar9 = uVar2;
          }
          for (lVar22 = 0; (ulong)uVar9 * 4 != lVar22; lVar22 = lVar22 + 4) {
            iVar10 = *(int *)((long)_index + lVar22);
            lVar20 = *(long *)((long)GA[g_a + 1000].block_dims + lVar22 * 2);
            *(long *)(err_string + lVar22 * 2) = lVar20 * iVar10 + 1;
            lVar20 = ((long)iVar10 + 1) * lVar20;
            lVar21 = *(long *)((long)GA[g_a + 1000].dims + lVar22 * 2);
            if (lVar21 <= lVar20) {
              lVar20 = lVar21;
            }
            *(long *)((long)_hi + lVar22 * 2) = lVar20;
          }
        }
        else if (iVar10 == 4) {
          lVar20 = lVar15 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar20;
          IVar18 = proc;
          lVar22 = 0;
          while (lVar22 + 1 < lVar16) {
            IVar18 = (long)((int)IVar18 - (int)lVar20) / GA[g_a + 1000].num_blocks[lVar22];
            lVar20 = (long)(int)IVar18 % GA[g_a + 1000].num_blocks[lVar22 + 1];
            _index[lVar22 + 1] = (int)lVar20;
            lVar22 = lVar22 + 1;
          }
          lVar22 = 0;
          uVar9 = 0;
          if (0 < (short)uVar2) {
            uVar9 = uVar2;
          }
          iVar10 = 0;
          for (; (ulong)uVar9 * 4 != lVar22; lVar22 = lVar22 + 4) {
            pCVar7 = GA[lVar1].mapc;
            iVar5 = *(int *)((long)_index + lVar22);
            lVar21 = (long)iVar10 + (long)iVar5;
            *(C_Integer *)(err_string + lVar22 * 2) = pCVar7[lVar21];
            lVar20 = *(long *)((long)GA[lVar1].num_blocks + lVar22 * 2);
            if ((long)iVar5 < lVar20 + -1) {
              lVar21 = pCVar7[lVar21 + 1] + -1;
            }
            else {
              lVar21 = *(long *)((long)GA[lVar1].dims + lVar22 * 2);
            }
            *(long *)((long)_hi + lVar22 * 2) = lVar21;
            iVar10 = iVar10 + (int)lVar20;
          }
        }
        else if (iVar10 == 0) {
          if (GA[lVar1].num_rstrctd == 0) {
            lVar22 = 0;
            if (0 < lVar16) {
              lVar22 = lVar16;
            }
            lVar20 = 1;
            for (lVar21 = 0; lVar22 != lVar21; lVar21 = lVar21 + 1) {
              lVar20 = lVar20 * GA[g_a + 1000].nblock[lVar21];
            }
            if ((proc < 0) || (lVar20 <= proc)) {
              for (lVar20 = 0; lVar22 != lVar20; lVar20 = lVar20 + 1) {
                plo_rcv[lVar20 + -0x20] = 0;
                _hi[lVar20] = -1;
              }
            }
            else {
              lVar21 = 0;
              IVar18 = proc;
              for (lVar20 = 0; lVar22 != lVar20; lVar20 = lVar20 + 1) {
                lVar27 = (long)GA[g_a + 1000].nblock[lVar20];
                lVar23 = IVar18 % lVar27;
                pCVar7 = GA[lVar1].mapc;
                plo_rcv[lVar20 + -0x20] = pCVar7[lVar23 + lVar21];
                if (lVar23 == lVar27 + -1) {
                  CVar24 = GA[g_a + 1000].dims[lVar20];
                }
                else {
                  CVar24 = pCVar7[lVar23 + lVar21 + 1] + -1;
                }
                lVar21 = lVar21 + lVar27;
                _hi[lVar20] = CVar24;
                IVar18 = IVar18 / lVar27;
              }
            }
          }
          else if (proc < GA[lVar1].num_rstrctd) {
            lVar22 = 0;
            if (0 < lVar16) {
              lVar22 = lVar16;
            }
            lVar20 = 1;
            for (lVar21 = 0; lVar22 != lVar21; lVar21 = lVar21 + 1) {
              lVar20 = lVar20 * GA[g_a + 1000].nblock[lVar21];
            }
            if ((proc < 0) || (lVar20 <= proc)) {
              for (lVar20 = 0; lVar22 != lVar20; lVar20 = lVar20 + 1) {
                plo_rcv[lVar20 + -0x20] = 0;
                _hi[lVar20] = -1;
              }
            }
            else {
              lVar21 = 0;
              IVar18 = proc;
              for (lVar20 = 0; lVar22 != lVar20; lVar20 = lVar20 + 1) {
                lVar27 = (long)GA[g_a + 1000].nblock[lVar20];
                lVar23 = IVar18 % lVar27;
                pCVar7 = GA[lVar1].mapc;
                plo_rcv[lVar20 + -0x20] = pCVar7[lVar23 + lVar21];
                if (lVar23 == lVar27 + -1) {
                  CVar24 = GA[g_a + 1000].dims[lVar20];
                }
                else {
                  CVar24 = pCVar7[lVar23 + lVar21 + 1] + -1;
                }
                lVar21 = lVar21 + lVar27;
                _hi[lVar20] = CVar24;
                IVar18 = IVar18 / lVar27;
              }
            }
          }
          else {
            iVar10 = 0;
            if (0 < (short)uVar2) {
              iVar10 = (int)(short)uVar2;
            }
            for (lVar22 = 0; iVar10 != lVar22; lVar22 = lVar22 + 1) {
              plo_rcv[lVar22 + -0x20] = 0;
              _hi[lVar22] = -1;
            }
          }
        }
        lVar22 = lVar16 + -1;
        if (lVar22 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
        }
        if (lVar22 < 1) {
          lVar22 = 0;
        }
        lVar20 = 1;
        lVar21 = 0;
        for (lVar23 = 0; lVar22 != lVar23; lVar23 = lVar23 + 1) {
          lVar21 = lVar21 + plo_rcv[lVar23] * lVar20;
          lVar27 = (_hi[lVar23] - plo_rcv[lVar23 + -0x20]) + GA[g_a + 1000].width[lVar23] * 2 + 1;
          ld_loc[lVar23] = lVar27;
          lVar20 = lVar20 * lVar27;
        }
        local_570[1] = (double)(GA[lVar1].ptr[proc] +
                               (long)GA[lVar1].elemsize * (lVar20 * plo_rcv[lVar16 + -1] + lVar21));
        *(int *)(local_570 + 4) = iVar3;
        *piVar25 = iVar3;
        for (lVar16 = 0; local_4f8 != lVar16; lVar16 = lVar16 + 1) {
          IVar18 = ld_loc[lVar16];
          piVar25[lVar16] = piVar25[lVar16] * (int)IVar18;
          *(int *)((long)local_570 + lVar16 * 4 + 0x20) =
               (int)IVar18 * *(int *)((long)local_570 + lVar16 * 4 + 0x20);
          *(int *)((long)local_570 + lVar16 * 4 + ndim * 4 + 0x24) = piVar25[lVar16];
          *(undefined4 *)((long)local_570 + lVar16 * 4 + 0x24) =
               *(undefined4 *)((long)local_570 + lVar16 * 4 + 0x20);
        }
        for (lVar16 = 0; lVar32 != lVar16; lVar16 = lVar16 + 1) {
          *(int *)((long)plVar19 + lVar16 * 4 + 8) =
               ((int)phi_rcv[lVar16] - (int)plo_rcv[lVar16]) + 1;
        }
        *plVar19 = 1;
        lVar16 = 1;
        for (lVar22 = 0; lVar32 != lVar22; lVar22 = lVar22 + 1) {
          lVar16 = lVar16 * ((phi_snd[lVar22] - plo_snd[lVar22]) + 1);
          *plVar19 = lVar16;
        }
        *plVar19 = lVar16 * lVar12;
        *(int *)(plVar19 + 1) = (int)plVar19[1] * iVar3;
        get_remote_block_pos(lVar14,ndim,lo_loc,hi_loc,slo_rcv,shi_rcv,dims,width);
        lVar11 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)pdVar13,&np);
        if (lVar11 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA[lVar1].name);
          sVar17 = strlen(err_string);
          sprintf(err_string + (int)sVar17," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
          sVar17 = strlen(err_string);
          lVar16 = 1;
          while( true ) {
            IVar18 = pnga_ndim(g_a);
            pcVar30 = err_string + (int)sVar17;
            if (IVar18 <= lVar16) break;
            sprintf(pcVar30,",%ld:%ld ",slo_rcv[lVar16],shi_rcv[lVar16]);
            sVar17 = strlen(err_string);
            lVar16 = lVar16 + 1;
          }
          pcVar30[0] = ']';
          pcVar30[1] = '\0';
          pnga_error(err_string,g_a);
        }
        dVar6 = *pdVar13;
        *(double *)((long)plVar19 + ndim * 4 + 0x18) = dVar6;
        if (-1 < iVar4) {
          *(long *)((long)plVar19 + ndim * 4 + 0x18) =
               (long)PGRP_LIST[iVar4].inv_map_proc_list[(long)dVar6];
        }
        lVar16 = ndim * 4 + 0x28;
        piVar25 = (int *)((long)puVar26 + (ndim + 8) * 4);
        plVar31 = (long *)(piVar25 + ndim);
        local_570 = (double *)((long)plVar31 + ndim * 4 + 8);
        for (lVar22 = 0; lVar32 != lVar22; lVar22 = lVar22 + 1) {
          if (lVar14 == lVar22) {
            lVar20 = lo_loc[lVar14] - width[lVar14];
            lVar21 = lo_loc[lVar14] + -1;
          }
          else {
            lVar20 = lo_loc[lVar22];
            lVar21 = hi_loc[lVar22];
          }
          lo_rcv[lVar22] = lVar20;
          hi_rcv[lVar22] = lVar21;
        }
        for (lVar22 = 0; lVar32 != lVar22; lVar22 = lVar22 + 1) {
          if (lVar14 == lVar22) {
            if (hi_rcv[lVar14] < 1) {
              shi_rcv[lVar14] = dims[lVar14];
              slo_rcv[lVar14] = (dims[lVar14] - width[lVar14]) + 1;
            }
            else {
              slo_rcv[lVar14] = lo_rcv[lVar14];
              shi_rcv[lVar14] = hi_rcv[lVar14];
            }
          }
          else {
            slo_rcv[lVar22] = lo_rcv[lVar22];
            shi_rcv[lVar22] = hi_rcv[lVar22];
          }
        }
        lVar11 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)pdVar13,&np);
        if (lVar11 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA[lVar1].name);
          sVar17 = strlen(err_string);
          sprintf(err_string + (int)sVar17," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
          sVar17 = strlen(err_string);
          lVar22 = 1;
          while( true ) {
            IVar18 = pnga_ndim(g_a);
            pcVar30 = err_string + (int)sVar17;
            if (IVar18 <= lVar22) break;
            sprintf(pcVar30,",%ld:%ld ",slo_rcv[lVar22],shi_rcv[lVar22]);
            sVar17 = strlen(err_string);
            lVar22 = lVar22 + 1;
          }
          pcVar30[0] = ']';
          pcVar30[1] = '\0';
          pnga_error(err_string,g_a);
        }
        dVar6 = *pdVar13;
        *(double *)((long)plVar19 + ndim * 4 + 0x20) = dVar6;
        if (-1 < iVar4) {
          *(long *)((long)plVar19 + ndim * 4 + 0x20) =
               (long)PGRP_LIST[iVar4].inv_map_proc_list[(long)dVar6];
        }
        for (lVar22 = 0; local_4f0 != lVar22; lVar22 = lVar22 + 8) {
          if (*(long *)((long)increment + lVar22) == 0) {
            if (lVar29 == lVar22) {
              plo_snd[lVar14] = (hi_loc[lVar14] - lo_loc[lVar14]) + 1;
              plo_rcv[lVar14] = 0;
              phi_snd[lVar14] = (hi_loc[lVar14] - lo_loc[lVar14]) + width[lVar14];
              phi_rcv[lVar14] = width[lVar14] + -1;
            }
            else {
              lVar20 = *(long *)((long)width + lVar22);
              *(long *)((long)plo_snd + lVar22) = lVar20;
              lVar21 = (*(long *)((long)hi_loc + lVar22) - *(long *)((long)lo_loc + lVar22)) +
                       lVar20;
              *(long *)((long)phi_snd + lVar22) = lVar21;
              *(long *)((long)plo_rcv + lVar22) = lVar20;
              *(long *)((long)phi_rcv + lVar22) = lVar21;
            }
          }
          else {
            *(undefined8 *)((long)plo_rcv + lVar22) = 0;
            lVar20 = (*(long *)((long)hi_loc + lVar22) - *(long *)((long)lo_loc + lVar22)) +
                     *(long *)((long)increment + lVar22);
            *(long *)((long)phi_rcv + lVar22) = lVar20;
            *(undefined8 *)((long)plo_snd + lVar22) = 0;
            *(long *)((long)phi_snd + lVar22) = lVar20;
          }
        }
        uVar2 = GA[lVar1].ndim;
        lVar22 = (long)(short)uVar2;
        iVar10 = GA[lVar1].distr_type;
        if (iVar10 - 1U < 3) {
          lVar21 = lVar15 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar21;
          IVar18 = proc;
          lVar20 = 0;
          while (lVar20 + 1 < lVar22) {
            IVar18 = (long)((int)IVar18 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar20];
            lVar21 = (long)(int)IVar18 % GA[g_a + 1000].num_blocks[lVar20 + 1];
            _index[lVar20 + 1] = (int)lVar21;
            lVar20 = lVar20 + 1;
          }
          uVar9 = 0;
          if (0 < (short)uVar2) {
            uVar9 = uVar2;
          }
          for (lVar20 = 0; (ulong)uVar9 * 4 != lVar20; lVar20 = lVar20 + 4) {
            iVar10 = *(int *)((long)_index + lVar20);
            lVar21 = *(long *)((long)GA[g_a + 1000].block_dims + lVar20 * 2);
            *(long *)(err_string + lVar20 * 2) = lVar21 * iVar10 + 1;
            lVar21 = ((long)iVar10 + 1) * lVar21;
            lVar23 = *(long *)((long)GA[g_a + 1000].dims + lVar20 * 2);
            if (lVar23 <= lVar21) {
              lVar21 = lVar23;
            }
            *(long *)((long)_hi + lVar20 * 2) = lVar21;
          }
        }
        else if (iVar10 == 4) {
          lVar21 = lVar15 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar21;
          IVar18 = proc;
          lVar20 = 0;
          while (lVar20 + 1 < lVar22) {
            IVar18 = (long)((int)IVar18 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar20];
            lVar21 = (long)(int)IVar18 % GA[g_a + 1000].num_blocks[lVar20 + 1];
            _index[lVar20 + 1] = (int)lVar21;
            lVar20 = lVar20 + 1;
          }
          lVar20 = 0;
          uVar9 = 0;
          if (0 < (short)uVar2) {
            uVar9 = uVar2;
          }
          iVar10 = 0;
          for (; (ulong)uVar9 * 4 != lVar20; lVar20 = lVar20 + 4) {
            pCVar7 = GA[lVar1].mapc;
            iVar5 = *(int *)((long)_index + lVar20);
            lVar23 = (long)iVar10 + (long)iVar5;
            *(C_Integer *)(err_string + lVar20 * 2) = pCVar7[lVar23];
            lVar21 = *(long *)((long)GA[lVar1].num_blocks + lVar20 * 2);
            if ((long)iVar5 < lVar21 + -1) {
              lVar23 = pCVar7[lVar23 + 1] + -1;
            }
            else {
              lVar23 = *(long *)((long)GA[lVar1].dims + lVar20 * 2);
            }
            *(long *)((long)_hi + lVar20 * 2) = lVar23;
            iVar10 = iVar10 + (int)lVar21;
          }
        }
        else if (iVar10 == 0) {
          if (GA[lVar1].num_rstrctd == 0) {
            lVar20 = 0;
            if (0 < lVar22) {
              lVar20 = lVar22;
            }
            lVar21 = 1;
            for (lVar23 = 0; lVar20 != lVar23; lVar23 = lVar23 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar23];
            }
            if ((proc < 0) || (lVar21 <= proc)) {
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                plo_rcv[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
            else {
              lVar23 = 0;
              IVar18 = proc;
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                lVar28 = (long)GA[g_a + 1000].nblock[lVar21];
                lVar27 = IVar18 % lVar28;
                pCVar7 = GA[lVar1].mapc;
                plo_rcv[lVar21 + -0x20] = pCVar7[lVar27 + lVar23];
                if (lVar27 == lVar28 + -1) {
                  CVar24 = GA[g_a + 1000].dims[lVar21];
                }
                else {
                  CVar24 = pCVar7[lVar27 + lVar23 + 1] + -1;
                }
                lVar23 = lVar23 + lVar28;
                _hi[lVar21] = CVar24;
                IVar18 = IVar18 / lVar28;
              }
            }
          }
          else if (proc < GA[lVar1].num_rstrctd) {
            lVar20 = 0;
            if (0 < lVar22) {
              lVar20 = lVar22;
            }
            lVar21 = 1;
            for (lVar23 = 0; lVar20 != lVar23; lVar23 = lVar23 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar23];
            }
            if ((proc < 0) || (lVar21 <= proc)) {
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                plo_rcv[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
            else {
              lVar23 = 0;
              IVar18 = proc;
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                lVar28 = (long)GA[g_a + 1000].nblock[lVar21];
                lVar27 = IVar18 % lVar28;
                pCVar7 = GA[lVar1].mapc;
                plo_rcv[lVar21 + -0x20] = pCVar7[lVar27 + lVar23];
                if (lVar27 == lVar28 + -1) {
                  CVar24 = GA[g_a + 1000].dims[lVar21];
                }
                else {
                  CVar24 = pCVar7[lVar27 + lVar23 + 1] + -1;
                }
                lVar23 = lVar23 + lVar28;
                _hi[lVar21] = CVar24;
                IVar18 = IVar18 / lVar28;
              }
            }
          }
          else {
            iVar10 = 0;
            if (0 < (short)uVar2) {
              iVar10 = (int)(short)uVar2;
            }
            for (lVar20 = 0; iVar10 != lVar20; lVar20 = lVar20 + 1) {
              plo_rcv[lVar20 + -0x20] = 0;
              _hi[lVar20] = -1;
            }
          }
        }
        lVar20 = lVar22 + -1;
        if (lVar20 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
        }
        if (lVar20 < 1) {
          lVar20 = 0;
        }
        lVar21 = 1;
        lVar23 = 0;
        for (lVar27 = 0; lVar20 != lVar27; lVar27 = lVar27 + 1) {
          lVar23 = lVar23 + plo_snd[lVar27] * lVar21;
          lVar28 = (_hi[lVar27] - plo_rcv[lVar27 + -0x20]) + GA[g_a + 1000].width[lVar27] * 2 + 1;
          ld_loc[lVar27] = lVar28;
          lVar21 = lVar21 * lVar28;
        }
        *puVar26 = GA[lVar1].ptr[proc] +
                   (long)GA[lVar1].elemsize * (lVar21 * plo_snd[lVar22 + -1] + lVar23);
        uVar2 = GA[lVar1].ndim;
        lVar22 = (long)(short)uVar2;
        iVar10 = GA[lVar1].distr_type;
        if (iVar10 - 1U < 3) {
          lVar21 = lVar15 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar21;
          IVar18 = proc;
          lVar20 = 0;
          while (lVar20 + 1 < lVar22) {
            IVar18 = (long)((int)IVar18 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar20];
            lVar21 = (long)(int)IVar18 % GA[g_a + 1000].num_blocks[lVar20 + 1];
            _index[lVar20 + 1] = (int)lVar21;
            lVar20 = lVar20 + 1;
          }
          uVar9 = 0;
          if (0 < (short)uVar2) {
            uVar9 = uVar2;
          }
          for (lVar20 = 0; (ulong)uVar9 * 4 != lVar20; lVar20 = lVar20 + 4) {
            iVar10 = *(int *)((long)_index + lVar20);
            lVar21 = *(long *)((long)GA[g_a + 1000].block_dims + lVar20 * 2);
            *(long *)(err_string + lVar20 * 2) = lVar21 * iVar10 + 1;
            lVar21 = ((long)iVar10 + 1) * lVar21;
            lVar23 = *(long *)((long)GA[g_a + 1000].dims + lVar20 * 2);
            if (lVar23 <= lVar21) {
              lVar21 = lVar23;
            }
            *(long *)((long)_hi + lVar20 * 2) = lVar21;
          }
        }
        else if (iVar10 == 4) {
          lVar21 = lVar15 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar21;
          IVar18 = proc;
          lVar20 = 0;
          while (lVar20 + 1 < lVar22) {
            IVar18 = (long)((int)IVar18 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar20];
            lVar21 = (long)(int)IVar18 % GA[g_a + 1000].num_blocks[lVar20 + 1];
            _index[lVar20 + 1] = (int)lVar21;
            lVar20 = lVar20 + 1;
          }
          lVar20 = 0;
          uVar9 = 0;
          if (0 < (short)uVar2) {
            uVar9 = uVar2;
          }
          iVar10 = 0;
          for (; (ulong)uVar9 * 4 != lVar20; lVar20 = lVar20 + 4) {
            pCVar7 = GA[lVar1].mapc;
            iVar5 = *(int *)((long)_index + lVar20);
            lVar23 = (long)iVar10 + (long)iVar5;
            *(C_Integer *)(err_string + lVar20 * 2) = pCVar7[lVar23];
            lVar21 = *(long *)((long)GA[lVar1].num_blocks + lVar20 * 2);
            if ((long)iVar5 < lVar21 + -1) {
              lVar23 = pCVar7[lVar23 + 1] + -1;
            }
            else {
              lVar23 = *(long *)((long)GA[lVar1].dims + lVar20 * 2);
            }
            *(long *)((long)_hi + lVar20 * 2) = lVar23;
            iVar10 = iVar10 + (int)lVar21;
          }
        }
        else if (iVar10 == 0) {
          if (GA[lVar1].num_rstrctd == 0) {
            lVar20 = 0;
            if (0 < lVar22) {
              lVar20 = lVar22;
            }
            lVar21 = 1;
            for (lVar23 = 0; lVar20 != lVar23; lVar23 = lVar23 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar23];
            }
            if ((proc < 0) || (lVar21 <= proc)) {
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                plo_rcv[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
            else {
              lVar23 = 0;
              IVar18 = proc;
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                lVar28 = (long)GA[g_a + 1000].nblock[lVar21];
                lVar27 = IVar18 % lVar28;
                pCVar7 = GA[lVar1].mapc;
                plo_rcv[lVar21 + -0x20] = pCVar7[lVar27 + lVar23];
                if (lVar27 == lVar28 + -1) {
                  CVar24 = GA[g_a + 1000].dims[lVar21];
                }
                else {
                  CVar24 = pCVar7[lVar27 + lVar23 + 1] + -1;
                }
                lVar23 = lVar23 + lVar28;
                _hi[lVar21] = CVar24;
                IVar18 = IVar18 / lVar28;
              }
            }
          }
          else if (proc < GA[lVar1].num_rstrctd) {
            lVar20 = 0;
            if (0 < lVar22) {
              lVar20 = lVar22;
            }
            lVar21 = 1;
            for (lVar23 = 0; lVar20 != lVar23; lVar23 = lVar23 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar23];
            }
            if ((proc < 0) || (lVar21 <= proc)) {
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                plo_rcv[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
            else {
              lVar23 = 0;
              IVar18 = proc;
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                lVar28 = (long)GA[g_a + 1000].nblock[lVar21];
                lVar27 = IVar18 % lVar28;
                pCVar7 = GA[lVar1].mapc;
                plo_rcv[lVar21 + -0x20] = pCVar7[lVar27 + lVar23];
                if (lVar27 == lVar28 + -1) {
                  CVar24 = GA[g_a + 1000].dims[lVar21];
                }
                else {
                  CVar24 = pCVar7[lVar27 + lVar23 + 1] + -1;
                }
                lVar23 = lVar23 + lVar28;
                _hi[lVar21] = CVar24;
                IVar18 = IVar18 / lVar28;
              }
            }
          }
          else {
            iVar10 = 0;
            if (0 < (short)uVar2) {
              iVar10 = (int)(short)uVar2;
            }
            for (lVar20 = 0; iVar10 != lVar20; lVar20 = lVar20 + 1) {
              plo_rcv[lVar20 + -0x20] = 0;
              _hi[lVar20] = -1;
            }
          }
        }
        lVar20 = lVar22 + -1;
        if (lVar20 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
        }
        if (lVar20 < 1) {
          lVar20 = 0;
        }
        lVar21 = 1;
        lVar23 = 0;
        for (lVar27 = 0; lVar20 != lVar27; lVar27 = lVar27 + 1) {
          lVar23 = lVar23 + plo_rcv[lVar27] * lVar21;
          lVar28 = (_hi[lVar27] - plo_rcv[lVar27 + -0x20]) + GA[g_a + 1000].width[lVar27] * 2 + 1;
          ld_loc[lVar27] = lVar28;
          lVar21 = lVar21 * lVar28;
        }
        *(char **)((long)plVar19 + ndim * 4 + 0x10) =
             GA[lVar1].ptr[proc] +
             (long)GA[lVar1].elemsize * (lVar21 * plo_rcv[lVar22 + -1] + lVar23);
        *(int *)((long)plVar19 + ndim * 4 + 0x28) = iVar3;
        *piVar25 = iVar3;
        for (lVar22 = 0; local_4f8 != lVar22; lVar22 = lVar22 + 1) {
          IVar18 = ld_loc[lVar22];
          piVar25[lVar22] = piVar25[lVar22] * (int)IVar18;
          *(int *)((long)plVar19 + lVar22 * 4 + lVar16) =
               (int)IVar18 * *(int *)((long)plVar19 + lVar22 * 4 + lVar16);
          *(int *)((long)puVar26 + (ndim + lVar22 + 9) * 4) = piVar25[lVar22];
          *(undefined4 *)((long)plVar19 + lVar22 * 4 + ndim * 4 + 0x2c) =
               *(undefined4 *)((long)plVar19 + lVar22 * 4 + lVar16);
        }
        for (lVar16 = 0; lVar32 != lVar16; lVar16 = lVar16 + 1) {
          *(int *)((long)plVar31 + lVar16 * 4 + 8) =
               ((int)phi_rcv[lVar16] - (int)plo_rcv[lVar16]) + 1;
        }
        *plVar31 = 1;
        lVar16 = 1;
        for (lVar22 = 0; lVar32 != lVar22; lVar22 = lVar22 + 1) {
          lVar16 = lVar16 * ((phi_snd[lVar22] - plo_snd[lVar22]) + 1);
          *plVar31 = lVar16;
        }
        *plVar31 = lVar16 * lVar12;
        *(int *)(plVar31 + 1) = (int)plVar31[1] * iVar3;
      }
      if (GA[lVar1].corner_flag != 0) {
        increment[lVar14] = width[lVar14] * 2;
      }
      lVar29 = lVar29 + 8;
    }
    free(map);
    free(pdVar13);
  }
  return 1;
}

Assistant:

logical pnga_set_update4_info(Integer g_a)
{
  Integer idx, idir, i, np, handle=GA_OFFSET + g_a;
  Integer size, buflen, buftot, *bufsize, ndim, increment[MAXDIM];
  Integer *proc_rem_snd, *proc_rem_rcv;
  Integer *length;
  Integer width[MAXDIM], dims[MAXDIM], index[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_snd[MAXDIM], phi_snd[MAXDIM];
  Integer lo_rcv[MAXDIM], hi_rcv[MAXDIM];
  Integer slo_rcv[MAXDIM], shi_rcv[MAXDIM];
  Integer plo_rcv[MAXDIM], phi_rcv[MAXDIM];
  Integer ld_loc[MAXDIM];
  int *stride_snd, *stride_rcv, *count, cache_size;
  /*int corner_flag;*/
  char **ptr_snd, **ptr_rcv, *cache;
  char *current;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine sets the arrays that are used to transfer data using
   * the update4. To perform the update, this routine makes use of several
   * copies of indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rcv[], hi_rcv[]: The lower and upper indices of the blocks
   *       of data that will be either sent to or received from a remote
   *       processor. These indices are NOT corrected for wrap-around
   *       (periodic) boundary conditions so they can be negative or greater
   *       than the array dimension values held in dims[].
   *
   *       slo_rcv[], shi_rcv[]: Similar to lo_rcv[] and hi_rcv[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions.
   *
   *       plo_rcv[], phi_rcv[]: The local indices of the local data patch
   *       that receive that message from the remote processor.
   *
   *       plo_snd[], phi_snd[]: The local indices of the data patch
   *       that will be sent to the remote processor. Note that the
   *       dimensions of the patches represented by plo_rec[], plo_rec[] and
   *       plo_snd[], phi_snd[] must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  cache_size = 2*sizeof(char *)+3*ndim*sizeof(int)+3*sizeof(Integer);
  cache_size = 2* ndim *((cache_size/8) + 1) + 1;
  GA[handle].cache = (double *)malloc(sizeof(double)*cache_size);
  cache = (char *)GA[handle].cache;
  /*corner_flag = GA[handle].corner_flag;*/
#if GHOST_PRINT
      printf("p[%d]a cache_size: %d\n",GAme,cache_size);
#endif

  /* initialize range increments and get array dimensions */

  pnga_distribution(g_a,me,lo_loc,hi_loc);
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) {
      *(char**)cache = NULL;
      return FALSE;
    }
  }

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_set_update4_info:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_set_update4_info:malloc failed (_ga_proclist)",0);

  /* Get indices of processor in virtual grid */
  pnga_proc_topology(g_a, me, index);

  /* Try to find maximum size of message that will be sent during
   * update operations and use this to allocate memory for message
   * passing buffers. */
  buftot = 1;
  for (i=0; i<ndim; i++) {
    buftot *= (hi_loc[i]-lo_loc[i] + 1 + 2*width[i]);
  }
  buflen = 1;
  for (i = 0; i < ndim; i++) {
    idir =  hi_loc[i] - lo_loc[i] + 1;
    if (buflen < (buftot/(idir + 2*width[i]))*width[i]) {
      buflen = (buftot/(idir + 2*width[i]))*width[i];
    }
  }
  bufsize = (Integer*)cache;
#if GHOST_PRINT
      printf("p[%d]a initial pointer: %d\n",GAme,(Integer)bufsize);
      fflush(stdout);
#endif
  current = (char*)(bufsize+1);

  *bufsize = size*buflen;
#if GHOST_PRINT
      printf("p[%d]a buflen: %d size: %d bufsize: %d\n",GAme,buflen,size,*bufsize);
      fflush(stdout);
#endif

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {

    /* Do not bother with update if nwidth is zero */
    if (width[idx] != 0) {

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = hi_loc[i] + 1;
          hi_rcv[i] = hi_loc[i] + width[i];
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] > dims[i]) {
            slo_rcv[i] = 1;
            shi_rcv[i] = width[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_rcv];
      }

      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = width[i];
            phi_snd[i] = 2*width[i] - 1;
            plo_rcv[i] = hi_loc[i] - lo_loc[i] + width[i] + 1;
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + 2*width[i];
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 1: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)*ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 1: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)*ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, length);
      *length *= size;
      count[0] *= size;

#if GHOST_PRINT
      printf("p[%d]a 1: length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, *length, *bufsize, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d]a 1: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]a 1: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]a 1: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]a 1: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      fflush(stdout);
#endif

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

      /* Find parameters for message in positive direction. */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = lo_loc[i] - width[i];
          hi_rcv[i] = lo_loc[i] - 1;
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] < 1) {
            slo_rcv[i] = dims[i] - width[i] + 1;
            shi_rcv[i] = dims[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_rcv];
      }
      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = hi_loc[i] - lo_loc[i] + 1;
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = 0;
            phi_rcv[i] = width[i] - 1;
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 2: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)*ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 2: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)*ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, length);
      *length *= size;
      count[0] *= size;
#if GHOST_PRINT
      printf("p[%d]a 2: length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, *length, *bufsize, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d]a 2: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]a 2: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]a 2: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]a 2: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      fflush(stdout);
#endif

    }
    if (GA[handle].corner_flag)
      increment[idx] = 2*width[idx];
  }
#if GHOST_PRINT
      printf("p[%d]a final pointer: %d\n",GAme,(Integer)(Integer*)current);
      fflush(stdout);
#endif
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}